

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprLoadDoclistsCb(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  Fts3Phrase *pFVar1;
  LoadDoclistCtx *p;
  Fts3Phrase *pPhrase;
  int rc;
  void *ctx_local;
  int iPhrase_local;
  Fts3Expr *pExpr_local;
  
  pFVar1 = pExpr->pPhrase;
  *(int *)((long)ctx + 8) = *(int *)((long)ctx + 8) + 1;
  *(int *)((long)ctx + 0xc) = pFVar1->nToken + *(int *)((long)ctx + 0xc);
  return 0;
}

Assistant:

static int fts3ExprLoadDoclistsCb(Fts3Expr *pExpr, int iPhrase, void *ctx){
  int rc = SQLITE_OK;
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  LoadDoclistCtx *p = (LoadDoclistCtx *)ctx;

  UNUSED_PARAMETER(iPhrase);

  p->nPhrase++;
  p->nToken += pPhrase->nToken;

  return rc;
}